

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.hpp
# Opt level: O0

scalar_type
pico_tree::internal::
sum<float_const*,float_const*,float_const*,pico_tree::internal::squared_r1_distance_fn>
          (long param_1,long param_2,squared_r1_distance_fn *param_3)

{
  float fVar1;
  scalar_type d;
  float in_stack_ffffffffffffffd8;
  float x;
  long local_10;
  
  x = 0.0;
  for (local_10 = param_1; local_10 != param_2; local_10 = local_10 + 4) {
    fVar1 = squared_r1_distance_fn::operator()(param_3,x,in_stack_ffffffffffffffd8);
    x = fVar1 + x;
    param_3 = param_3 + 4;
  }
  return x;
}

Assistant:

constexpr auto sum(
    InputIterator1_ begin1,
    InputSentinel1_ end1,
    InputIterator2_ begin2,
    BinaryOperator op) {
  using scalar_type =
      typename std::iterator_traits<InputIterator1_>::value_type;

  scalar_type d{};

  for (; begin1 != end1; ++begin1, ++begin2) {
    d += op(*begin1, *begin2);
  }

  return d;
}